

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O3

void __thiscall spirv_cross::DominatorBuilder::add_block(DominatorBuilder *this,uint32_t block)

{
  uint32_t uVar1;
  const_iterator cVar2;
  key_type local_14;
  
  cVar2 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->cfg->immediate_dominators)._M_h,&local_14);
  if ((cVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur !=
       (__node_type *)0x0) &&
     (*(int *)((long)cVar2.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                     _M_cur + 0xc) != 0)) {
    uVar1 = this->dominator;
    if (uVar1 == 0) {
      this->dominator = block;
    }
    else if (uVar1 != block) {
      uVar1 = CFG::find_common_dominator(this->cfg,block,uVar1);
      this->dominator = uVar1;
    }
  }
  return;
}

Assistant:

void DominatorBuilder::add_block(uint32_t block)
{
	if (!cfg.get_immediate_dominator(block))
	{
		// Unreachable block via the CFG, we will never emit this code anyways.
		return;
	}

	if (!dominator)
	{
		dominator = block;
		return;
	}

	if (block != dominator)
		dominator = cfg.find_common_dominator(block, dominator);
}